

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::parse_declaration_encoding
               (uint8_t *data,size_t size,uint8_t **out_encoding,size_t *out_length)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  uint8_t uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (size < 6) {
    return false;
  }
  if (*data != '<') {
    return false;
  }
  if (data[1] != '?') {
    return false;
  }
  if (data[2] != 'x') {
    return false;
  }
  if (data[3] != 'm') {
    return false;
  }
  if (data[4] != 'l') {
    return false;
  }
  if (size < 8 || ((anonymous_namespace)::chartype_table[data[5]] & 8) == 0) {
    return false;
  }
  uVar4 = 0xf;
LAB_00135c11:
  if (data[uVar4 - 9] == 'e') {
    if (data[uVar4 - 8] == 'n') {
      if (size <= uVar4 - 9) {
        return false;
      }
      if (size <= uVar4 - 7) {
        return false;
      }
      if (data[uVar4 - 7] != 'c') {
        return false;
      }
      if (size <= uVar4 - 6) {
        return false;
      }
      if (data[uVar4 - 6] != 'o') {
        return false;
      }
      if (size <= uVar4 - 5) {
        return false;
      }
      if (data[uVar4 - 5] != 'd') {
        return false;
      }
      if (size <= uVar4 - 4) {
        return false;
      }
      if (data[uVar4 - 4] != 'i') {
        return false;
      }
      if (size <= uVar4 - 3) {
        return false;
      }
      if (data[uVar4 - 3] != 'n') {
        return false;
      }
      if (size <= uVar4 - 2) {
        return false;
      }
      if (data[uVar4 - 2] != 'g') {
        return false;
      }
      bVar7 = uVar4 - 1 < size;
      if (!bVar7) {
        return false;
      }
      bVar2 = (anonymous_namespace)::chartype_table[data[uVar4 - 1]];
      uVar6 = uVar4 - 1;
      while ((bVar2 & 8) != 0) {
        bVar7 = uVar4 < size;
        if (!bVar7) {
          return false;
        }
        bVar2 = (anonymous_namespace)::chartype_table[data[uVar4]];
        uVar6 = uVar4;
        uVar4 = uVar4 + 1;
      }
      if ((bVar7) && (data[uVar6] == '=')) {
        uVar4 = uVar6 + 2;
        do {
          uVar6 = uVar4;
          if (size <= uVar6 - 1) {
            uVar5 = '\'';
            goto LAB_00135d75;
          }
          uVar4 = uVar6 + 1;
        } while (((anonymous_namespace)::chartype_table[data[uVar6 - 1]] & 8) != 0);
        uVar5 = (data[uVar6 - 1] != 0x22) * '\x05' + '\"';
LAB_00135d75:
        if ((uVar6 - 1 < size) && (uVar5 == data[uVar6 - 1])) {
          *out_encoding = data + uVar6;
          bVar7 = uVar6 < size;
          if (!bVar7) {
LAB_00135df5:
            sVar3 = 0;
            if (uVar6 <= size) {
              sVar3 = size - uVar6;
            }
            *out_length = sVar3;
            return false;
          }
          uVar4 = uVar6;
          if (((anonymous_namespace)::chartype_table[data[uVar6]] & 0x40) != 0) {
            do {
              if ((3 - size) + uVar4 == 2) goto LAB_00135df5;
              lVar1 = uVar4 + 1;
              uVar4 = uVar4 + 1;
            } while (((anonymous_namespace)::chartype_table[data[lVar1]] & 0x40) != 0);
            bVar7 = uVar4 < size;
          }
          *out_length = uVar4 - uVar6;
          if (bVar7) {
            return uVar5 == data[uVar4];
          }
        }
      }
      return false;
    }
  }
  else if (data[uVar4 - 9] == '?') {
    return false;
  }
  lVar1 = uVar4 - size;
  uVar4 = uVar4 + 1;
  if (lVar1 == 7) {
    return false;
  }
  goto LAB_00135c11;
}

Assistant:

PUGI__FN bool parse_declaration_encoding(const uint8_t* data, size_t size, const uint8_t*& out_encoding, size_t& out_length)
	{
	#define PUGI__SCANCHAR(ch) { if (offset >= size || data[offset] != ch) return false; offset++; }
	#define PUGI__SCANCHARTYPE(ct) { while (offset < size && PUGI__IS_CHARTYPE(data[offset], ct)) offset++; }

		// check if we have a non-empty XML declaration
		if (size < 6 || !((data[0] == '<') & (data[1] == '?') & (data[2] == 'x') & (data[3] == 'm') & (data[4] == 'l') && PUGI__IS_CHARTYPE(data[5], ct_space)))
			return false;

		// scan XML declaration until the encoding field
		for (size_t i = 6; i + 1 < size; ++i)
		{
			// declaration can not contain ? in quoted values
			if (data[i] == '?')
				return false;

			if (data[i] == 'e' && data[i + 1] == 'n')
			{
				size_t offset = i;

				// encoding follows the version field which can't contain 'en' so this has to be the encoding if XML is well formed
				PUGI__SCANCHAR('e'); PUGI__SCANCHAR('n'); PUGI__SCANCHAR('c'); PUGI__SCANCHAR('o');
				PUGI__SCANCHAR('d'); PUGI__SCANCHAR('i'); PUGI__SCANCHAR('n'); PUGI__SCANCHAR('g');

				// S? = S?
				PUGI__SCANCHARTYPE(ct_space);
				PUGI__SCANCHAR('=');
				PUGI__SCANCHARTYPE(ct_space);

				// the only two valid delimiters are ' and "
				uint8_t delimiter = (offset < size && data[offset] == '"') ? '"' : '\'';

				PUGI__SCANCHAR(delimiter);

				size_t start = offset;

				out_encoding = data + offset;

				PUGI__SCANCHARTYPE(ct_symbol);

				out_length = offset - start;

				PUGI__SCANCHAR(delimiter);

				return true;
			}
		}

		return false;

	#undef PUGI__SCANCHAR
	#undef PUGI__SCANCHARTYPE
	}